

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractfileengine.cpp
# Opt level: O3

unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> __thiscall
QAbstractFileEngine::create(QAbstractFileEngine *this,QString *fileName)

{
  _func_int **pp_Var1;
  QFSFileEngine *this_00;
  long in_FS_OFFSET;
  QFileSystemEntry entry;
  QString local_a8;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  QArrayData *local_58;
  char16_t *pcStack_50;
  undefined1 *local_48;
  QArrayData *pQStack_40;
  char *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_40 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  pcStack_50 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QFileSystemEntry::QFileSystemEntry((QFileSystemEntry *)&local_58,fileName);
  local_90 = 0;
  local_88 = 0xffffffffffffffff;
  local_80 = 0;
  uStack_78 = 0;
  local_70 = 0;
  uStack_68 = 0;
  local_60 = 0xfffffffefffffffe;
  this->_vptr_QAbstractFileEngine = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  QFileSystemEngine::createLegacyEngine((QFileSystemEntry *)this,(QFileSystemMetaData *)&local_58);
  if (this->_vptr_QAbstractFileEngine == (_func_int **)0x0) {
    QFileSystemEntry::filePath(&local_a8,(QFileSystemEntry *)&local_58);
    this_00 = (QFSFileEngine *)operator_new(0x10);
    QFSFileEngine::QFSFileEngine(this_00,&local_a8);
    pp_Var1 = this->_vptr_QAbstractFileEngine;
    this->_vptr_QAbstractFileEngine = (_func_int **)this_00;
    if (pp_Var1 != (_func_int **)0x0) {
      (**(code **)(*pp_Var1 + 8))();
    }
    if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (pQStack_40 != (QArrayData *)0x0) {
    LOCK();
    (pQStack_40->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQStack_40->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQStack_40->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQStack_40,1,0x10);
    }
  }
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (__uniq_ptr_data<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>,_true,_true>
            )(__uniq_ptr_data<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>,_true,_true>
              )this;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<QAbstractFileEngine> QAbstractFileEngine::create(const QString &fileName)
{
    QFileSystemEntry entry(fileName);
    QFileSystemMetaData metaData;
    auto engine = QFileSystemEngine::createLegacyEngine(entry, metaData);

#ifndef QT_NO_FSFILEENGINE
    if (!engine) // fall back to regular file engine
        engine = std::make_unique<QFSFileEngine>(entry.filePath());
#endif

    return engine;
}